

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,bool post_process,
              float coeff,int keepdims,Option *opt)

{
  size_t sVar1;
  bool bVar2;
  int i_1;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  Mat *pMVar7;
  ulong uVar8;
  ulong uVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  int iVar11;
  int q;
  byte bVar12;
  char cVar13;
  Mat *pMVar14;
  ulong uVar15;
  Mat *pMVar16;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  void *pvVar21;
  uint uVar22;
  Mat *pMVar23;
  float fVar24;
  undefined4 in_stack_0000000c;
  int local_d8;
  int local_d0;
  Mat sums;
  Mat local_78;
  
  lVar5 = CONCAT44(in_stack_0000000c,keepdims);
  sVar1 = a->elemsize;
  iVar11 = a->dims;
  pMVar14 = b;
  if ((int)CONCAT71(in_register_00000089,post_process) == 0) {
    if (iVar11 == 3) {
      uVar3 = a->w;
      lVar19 = (long)(int)uVar3;
      uVar22 = a->h;
      uVar20 = a->c;
      uVar17 = uVar22 * uVar3;
      bVar2 = !reduce_h;
      pMVar14 = (Mat *)(CONCAT71(in_register_00000081,reduce_c) & 0xffffffff ^ 1);
      cVar13 = (char)pMVar14;
      if ((reduce_w && !bVar2) && cVar13 == '\0') {
        Mat::create(b,1,sVar1,*(Allocator **)(lVar5 + 8));
        pMVar14 = (Mat *)(ulong)uVar20;
        Mat::Mat(&sums,uVar20,sVar1,*(Allocator **)(lVar5 + 0x10));
        local_d8 = -100;
        iVar11 = local_d8;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          uVar6 = 0;
          uVar18 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar18 = uVar6;
          }
          uVar9 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar9 = uVar6;
          }
          for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
            pMVar14 = a;
            Mat::channel(&local_78,a,(int)uVar6);
            pvVar4 = local_78.data;
            Mat::~Mat(&local_78);
            fVar24 = 0.0;
            for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
              fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + uVar15 * 4));
            }
            *(float *)((long)sums.data + uVar6 * 4) = fVar24;
          }
          fVar24 = 0.0;
          for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
            fVar24 = fVar24 + *(float *)((long)sums.data + uVar18 * 4);
          }
          goto LAB_001e4710;
        }
      }
      else {
        if ((reduce_w && !bVar2) && !reduce_c) {
          pMVar14 = (Mat *)(ulong)uVar20;
          Mat::create(b,uVar20,sVar1,*(Allocator **)(lVar5 + 8));
          uVar6 = 0;
          uVar18 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar18 = uVar6;
          }
          uVar9 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar9 = uVar6;
          }
          for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
            pMVar14 = a;
            Mat::channel(&sums,a,(int)uVar6);
            pvVar4 = sums.data;
            Mat::~Mat(&sums);
            fVar24 = 0.0;
            for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
              fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + uVar15 * 4));
            }
            *(float *)((long)b->data + uVar6 * 4) = fVar24;
          }
          goto LAB_001e4ea2;
        }
        if ((reduce_w && !reduce_h) && !reduce_c) {
          pMVar14 = (Mat *)(ulong)uVar22;
          Mat::create(b,uVar22,uVar20,sVar1,*(Allocator **)(lVar5 + 8));
          uVar18 = 0;
          uVar6 = 0;
          if (0 < (int)uVar3) {
            uVar6 = (ulong)uVar3;
          }
          uVar9 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar9 = uVar18;
          }
          uVar15 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar15 = uVar18;
          }
          for (; uVar18 != uVar15; uVar18 = uVar18 + 1) {
            pMVar14 = a;
            Mat::channel(&sums,a,(int)uVar18);
            pvVar21 = sums.data;
            Mat::~Mat(&sums);
            iVar11 = b->w;
            sVar1 = b->elemsize;
            pvVar4 = b->data;
            for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
              fVar24 = 0.0;
              for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
                fVar24 = fVar24 + ABS(*(float *)((long)pvVar21 + uVar10 * 4));
              }
              *(float *)((long)pvVar4 + uVar8 * 4 + (long)iVar11 * uVar18 * sVar1) = fVar24;
              pvVar21 = (void *)((long)pvVar21 + lVar19 * 4);
            }
          }
          goto LAB_001e4ea2;
        }
        if ((reduce_w && !reduce_h) && cVar13 == '\0') {
          Mat::create(b,uVar22,sVar1,*(Allocator **)(lVar5 + 8));
          pMVar14 = (Mat *)0x1;
          Mat::Mat(&sums,1,uVar22,uVar20,sVar1,*(Allocator **)(lVar5 + 0x10));
          local_d8 = -100;
          iVar11 = local_d8;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            Mat::fill(&sums,0.0);
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar3) {
              uVar18 = (ulong)uVar3;
            }
            if ((int)uVar22 < 1) {
              uVar22 = 0;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
              Mat::channel(&local_78,a,uVar17);
              pvVar4 = local_78.data;
              Mat::~Mat(&local_78);
              pMVar14 = &sums;
              Mat::channel(&local_78,pMVar14,uVar17);
              pvVar21 = local_78.data;
              Mat::~Mat(&local_78);
              for (uVar6 = 0; uVar6 != uVar22; uVar6 = uVar6 + 1) {
                fVar24 = 0.0;
                for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
                  fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + uVar9 * 4));
                }
                *(float *)((long)pvVar21 + uVar6 * 4) = fVar24;
                pvVar4 = (void *)((long)pvVar4 + lVar19 * 4);
              }
            }
            Mat::fill(b,0.0);
            local_d8 = 0;
            for (uVar3 = 0; iVar11 = local_d8, uVar3 != uVar20; uVar3 = uVar3 + 1) {
              pMVar14 = &sums;
              Mat::channel(&local_78,&sums,uVar3);
              pvVar21 = local_78.data;
              Mat::~Mat(&local_78);
              pvVar4 = b->data;
              for (uVar18 = 0; uVar22 != uVar18; uVar18 = uVar18 + 1) {
                *(float *)((long)pvVar4 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) + *(float *)((long)pvVar4 + uVar18 * 4);
              }
            }
          }
        }
        else {
          if ((bVar2 || reduce_w) || cVar13 != '\0') {
            if ((reduce_w || reduce_h) || cVar13 != '\0') {
              if ((!bVar2 && !reduce_w) && !reduce_c) {
                pMVar14 = (Mat *)(ulong)uVar3;
                Mat::create(b,uVar3,uVar20,sVar1,*(Allocator **)(lVar5 + 8));
                Mat::fill(b,0.0);
                uVar18 = 0;
                uVar6 = 0;
                if (0 < (int)uVar3) {
                  uVar6 = (ulong)uVar3;
                }
                if ((int)uVar22 < 1) {
                  uVar22 = 0;
                }
                uVar9 = (ulong)uVar20;
                if ((int)uVar20 < 1) {
                  uVar9 = uVar18;
                }
                for (; uVar18 != uVar9; uVar18 = uVar18 + 1) {
                  pMVar14 = a;
                  Mat::channel(&sums,a,(int)uVar18);
                  pvVar21 = sums.data;
                  Mat::~Mat(&sums);
                  lVar5 = b->elemsize * uVar18 * (long)b->w;
                  pvVar4 = b->data;
                  for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
                    for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
                      *(float *)((long)pvVar4 + uVar15 * 4 + lVar5) =
                           ABS(*(float *)((long)pvVar21 + uVar15 * 4)) +
                           *(float *)((long)pvVar4 + uVar15 * 4 + lVar5);
                    }
                    pvVar21 = (void *)((long)pvVar21 + lVar19 * 4);
                  }
                }
              }
            }
            else {
              pMVar14 = (Mat *)(ulong)uVar3;
              Mat::create(b,uVar3,uVar22,sVar1,*(Allocator **)(lVar5 + 8));
              Mat::fill(b,0.0);
              uVar6 = 0;
              uVar18 = (ulong)uVar17;
              if ((int)uVar17 < 1) {
                uVar18 = uVar6;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              while (uVar3 = (uint)uVar6, uVar3 != uVar20) {
                pMVar14 = a;
                Mat::channel(&sums,a,uVar3);
                pvVar21 = sums.data;
                Mat::~Mat(&sums);
                pvVar4 = b->data;
                for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
                  *(float *)((long)pvVar4 + uVar6 * 4) =
                       ABS(*(float *)((long)pvVar21 + uVar6 * 4)) +
                       *(float *)((long)pvVar4 + uVar6 * 4);
                }
                uVar6 = (ulong)(uVar3 + 1);
              }
            }
            goto LAB_001e4ea2;
          }
          Mat::create(b,uVar3,sVar1,*(Allocator **)(lVar5 + 8));
          pMVar14 = (Mat *)(ulong)uVar3;
          Mat::Mat(&sums,uVar3,1,uVar20,sVar1,*(Allocator **)(lVar5 + 0x10));
          local_d8 = -100;
          iVar11 = local_d8;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            Mat::fill(&sums,0.0);
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar3) {
              uVar18 = (ulong)uVar3;
            }
            if ((int)uVar22 < 1) {
              uVar22 = 0;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
              Mat::channel(&local_78,a,uVar17);
              pvVar4 = local_78.data;
              Mat::~Mat(&local_78);
              pMVar14 = &sums;
              Mat::channel(&local_78,pMVar14,uVar17);
              pvVar21 = local_78.data;
              Mat::~Mat(&local_78);
              for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
                for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
                  *(float *)((long)pvVar21 + uVar6 * 4) =
                       ABS(*(float *)((long)pvVar4 + uVar6 * 4)) +
                       *(float *)((long)pvVar21 + uVar6 * 4);
                }
                pvVar4 = (void *)((long)pvVar4 + lVar19 * 4);
              }
            }
            Mat::fill(b,0.0);
            local_d8 = 0;
            for (uVar3 = 0; iVar11 = local_d8, uVar3 != uVar20; uVar3 = uVar3 + 1) {
              pMVar14 = &sums;
              Mat::channel(&local_78,&sums,uVar3);
              pvVar21 = local_78.data;
              Mat::~Mat(&local_78);
              pvVar4 = b->data;
              for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)pvVar4 + uVar6 * 4) =
                     *(float *)((long)pvVar21 + uVar6 * 4) + *(float *)((long)pvVar4 + uVar6 * 4);
              }
            }
          }
        }
      }
    }
    else {
      if (iVar11 != 2) {
        if (iVar11 != 1) goto LAB_001e4ea2;
        uVar3 = a->w;
        pMVar14 = (Mat *)0x1;
        Mat::create(b,1,sVar1,*(Allocator **)(lVar5 + 8));
        uVar6 = 0;
        uVar18 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar18 = uVar6;
        }
        fVar24 = 0.0;
        for (; uVar18 != uVar6; uVar6 = uVar6 + 1) {
          fVar24 = fVar24 + ABS(*(float *)((long)a->data + uVar6 * 4));
        }
        goto LAB_001e3cf3;
      }
      uVar3 = a->w;
      uVar22 = a->h;
      uVar18 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
      bVar12 = (byte)uVar18 ^ 1;
      if (bVar12 != 0 || !reduce_h) {
        bVar12 = bVar12 | reduce_h;
        pMVar14 = (Mat *)CONCAT71((int7)(uVar18 >> 8),bVar12);
        if (bVar12 == 0) {
          Mat::create(b,uVar22,sVar1,*(Allocator **)(lVar5 + 8));
          pvVar4 = a->data;
          iVar11 = a->w;
          sVar1 = a->elemsize;
          pvVar21 = b->data;
          pMVar14 = (Mat *)0x0;
          pMVar7 = (Mat *)(ulong)uVar3;
          if ((int)uVar3 < 1) {
            pMVar7 = pMVar14;
          }
          pMVar23 = (Mat *)(ulong)uVar22;
          if ((int)uVar22 < 1) {
            pMVar23 = pMVar14;
          }
          for (; pMVar14 != pMVar23; pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
            fVar24 = 0.0;
            for (pMVar16 = (Mat *)0x0; pMVar7 != pMVar16;
                pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
              fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + (long)pMVar16 * 4));
            }
            *(float *)((long)pvVar21 + (long)pMVar14 * 4) = fVar24;
            pvVar4 = (void *)((long)pvVar4 + (long)iVar11 * sVar1);
          }
        }
        else if (reduce_h && !reduce_w) {
          pMVar14 = (Mat *)(ulong)uVar3;
          Mat::create(b,uVar3,sVar1,*(Allocator **)(lVar5 + 8));
          Mat::fill(b,0.0);
          pvVar4 = a->data;
          iVar11 = a->w;
          sVar1 = a->elemsize;
          uVar6 = 0;
          uVar18 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar18 = uVar6;
          }
          uVar9 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar9 = uVar6;
          }
          for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
            pMVar14 = (Mat *)b->data;
            for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
              *(float *)((long)&pMVar14->data + uVar15 * 4) =
                   ABS(*(float *)((long)pvVar4 + uVar15 * 4)) +
                   *(float *)((long)&pMVar14->data + uVar15 * 4);
            }
            pvVar4 = (void *)((long)pvVar4 + (long)iVar11 * sVar1);
          }
        }
        goto LAB_001e4ea2;
      }
      Mat::create(b,1,sVar1,*(Allocator **)(lVar5 + 8));
      pMVar14 = (Mat *)(ulong)uVar22;
      Mat::Mat(&sums,uVar22,sVar1,*(Allocator **)(lVar5 + 0x10));
      local_d8 = -100;
      iVar11 = local_d8;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        pvVar4 = a->data;
        iVar11 = a->w;
        sVar1 = a->elemsize;
        pMVar14 = (Mat *)0x0;
        pMVar7 = (Mat *)(ulong)uVar3;
        if ((int)uVar3 < 1) {
          pMVar7 = pMVar14;
        }
        pMVar23 = (Mat *)(ulong)uVar22;
        if ((int)uVar22 < 1) {
          pMVar23 = pMVar14;
        }
        for (; pMVar14 != pMVar23; pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
          fVar24 = 0.0;
          for (pMVar16 = (Mat *)0x0; pMVar7 != pMVar16; pMVar16 = (Mat *)((long)&pMVar16->data + 1))
          {
            fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + (long)pMVar16 * 4));
          }
          *(float *)((long)sums.data + (long)pMVar14 * 4) = fVar24;
          pvVar4 = (void *)((long)pvVar4 + (long)iVar11 * sVar1);
        }
        fVar24 = 0.0;
        for (pMVar7 = (Mat *)0x0; pMVar23 != pMVar7; pMVar7 = (Mat *)((long)&pMVar7->data + 1)) {
          fVar24 = fVar24 + *(float *)((long)sums.data + (long)pMVar7 * 4);
        }
        goto LAB_001e4710;
      }
    }
  }
  else if (iVar11 == 3) {
    uVar3 = a->w;
    lVar19 = (long)(int)uVar3;
    uVar22 = a->h;
    uVar20 = a->c;
    uVar17 = uVar22 * uVar3;
    bVar2 = !reduce_h;
    pMVar14 = (Mat *)(CONCAT71(in_register_00000081,reduce_c) & 0xffffffff ^ 1);
    cVar13 = (char)pMVar14;
    if ((reduce_w && !bVar2) && cVar13 == '\0') {
      Mat::create(b,1,1,1,sVar1,*(Allocator **)(lVar5 + 8));
      pMVar14 = (Mat *)(ulong)uVar20;
      Mat::Mat(&sums,uVar20,sVar1,*(Allocator **)(lVar5 + 0x10));
      local_d8 = -100;
      iVar11 = local_d8;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        uVar6 = 0;
        uVar18 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar18 = uVar6;
        }
        uVar9 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar9 = uVar6;
        }
        for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
          pMVar14 = a;
          Mat::channel(&local_78,a,(int)uVar6);
          pvVar4 = local_78.data;
          Mat::~Mat(&local_78);
          fVar24 = 0.0;
          for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
            fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + uVar15 * 4));
          }
          *(float *)((long)sums.data + uVar6 * 4) = fVar24;
        }
        fVar24 = 0.0;
        for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
          fVar24 = fVar24 + *(float *)((long)sums.data + uVar18 * 4);
        }
LAB_001e4710:
        *(float *)b->data = fVar24;
        local_d8 = 0;
        iVar11 = local_d8;
      }
    }
    else {
      if ((reduce_w && !bVar2) && !reduce_c) {
        pMVar14 = (Mat *)0x1;
        Mat::create(b,1,1,uVar20,sVar1,*(Allocator **)(lVar5 + 8));
        uVar6 = 0;
        uVar18 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar18 = uVar6;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        while (uVar3 = (uint)uVar6, uVar3 != uVar20) {
          Mat::channel(&sums,a,uVar3);
          pvVar4 = sums.data;
          Mat::~Mat(&sums);
          pMVar14 = b;
          Mat::channel(&sums,b,uVar3);
          pvVar21 = sums.data;
          Mat::~Mat(&sums);
          fVar24 = 0.0;
          for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
            fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + uVar6 * 4));
          }
          *(float *)pvVar21 = fVar24;
          uVar6 = (ulong)(uVar3 + 1);
        }
        goto LAB_001e4ea2;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        pMVar14 = (Mat *)0x1;
        Mat::create(b,1,uVar22,uVar20,sVar1,*(Allocator **)(lVar5 + 8));
        uVar18 = 0;
        uVar6 = 0;
        if (0 < (int)uVar3) {
          uVar6 = (ulong)uVar3;
        }
        uVar9 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar9 = uVar18;
        }
        uVar15 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar15 = uVar18;
        }
        while( true ) {
          local_d0 = (int)uVar15;
          iVar11 = (int)uVar18;
          if (iVar11 == local_d0) break;
          Mat::channel(&sums,a,iVar11);
          pvVar4 = sums.data;
          Mat::~Mat(&sums);
          pMVar14 = b;
          Mat::channel(&sums,b,iVar11);
          pvVar21 = sums.data;
          Mat::~Mat(&sums);
          for (uVar18 = 0; uVar18 != uVar9; uVar18 = uVar18 + 1) {
            fVar24 = 0.0;
            for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
              fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + uVar8 * 4));
            }
            *(float *)((long)pvVar21 + uVar18 * 4) = fVar24;
            pvVar4 = (void *)((long)pvVar4 + lVar19 * 4);
          }
          uVar18 = (ulong)(iVar11 + 1);
        }
        goto LAB_001e4ea2;
      }
      if ((reduce_w && !reduce_h) && cVar13 == '\0') {
        Mat::create(b,1,uVar22,1,sVar1,*(Allocator **)(lVar5 + 8));
        pMVar14 = (Mat *)0x1;
        Mat::Mat(&sums,1,uVar22,uVar20,sVar1,*(Allocator **)(lVar5 + 0x10));
        local_d8 = -100;
        iVar11 = local_d8;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar17 = 0;
          uVar18 = 0;
          if (0 < (int)uVar3) {
            uVar18 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
            Mat::channel(&local_78,a,uVar17);
            pvVar4 = local_78.data;
            Mat::~Mat(&local_78);
            pMVar14 = &sums;
            Mat::channel(&local_78,pMVar14,uVar17);
            pvVar21 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar6 = 0; uVar6 != uVar22; uVar6 = uVar6 + 1) {
              fVar24 = 0.0;
              for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
                fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + uVar9 * 4));
              }
              *(float *)((long)pvVar21 + uVar6 * 4) = fVar24;
              pvVar4 = (void *)((long)pvVar4 + lVar19 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_d8 = 0;
          for (uVar3 = 0; iVar11 = local_d8, uVar3 != uVar20; uVar3 = uVar3 + 1) {
            pMVar14 = &sums;
            Mat::channel(&local_78,&sums,uVar3);
            pvVar21 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar4 = b->data;
            for (uVar18 = 0; uVar22 != uVar18; uVar18 = uVar18 + 1) {
              *(float *)((long)pvVar4 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) + *(float *)((long)pvVar4 + uVar18 * 4);
            }
          }
        }
      }
      else {
        if ((bVar2 || reduce_w) || cVar13 != '\0') {
          if ((reduce_w || reduce_h) || cVar13 != '\0') {
            if ((!bVar2 && !reduce_w) && !reduce_c) {
              pMVar14 = (Mat *)(ulong)uVar3;
              Mat::create(b,uVar3,1,uVar20,sVar1,*(Allocator **)(lVar5 + 8));
              Mat::fill(b,0.0);
              uVar17 = 0;
              uVar18 = 0;
              if (0 < (int)uVar3) {
                uVar18 = (ulong)uVar3;
              }
              if ((int)uVar22 < 1) {
                uVar22 = 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = uVar17;
              }
              for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
                Mat::channel(&sums,a,uVar17);
                pvVar4 = sums.data;
                Mat::~Mat(&sums);
                pMVar14 = b;
                Mat::channel(&sums,b,uVar17);
                pvVar21 = sums.data;
                Mat::~Mat(&sums);
                for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
                  for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
                    *(float *)((long)pvVar21 + uVar6 * 4) =
                         ABS(*(float *)((long)pvVar4 + uVar6 * 4)) +
                         *(float *)((long)pvVar21 + uVar6 * 4);
                  }
                  pvVar4 = (void *)((long)pvVar4 + lVar19 * 4);
                }
              }
            }
          }
          else {
            pMVar14 = (Mat *)(ulong)uVar3;
            Mat::create(b,uVar3,uVar22,1,sVar1,*(Allocator **)(lVar5 + 8));
            Mat::fill(b,0.0);
            uVar6 = 0;
            uVar18 = (ulong)uVar17;
            if ((int)uVar17 < 1) {
              uVar18 = uVar6;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            while (uVar3 = (uint)uVar6, uVar3 != uVar20) {
              pMVar14 = a;
              Mat::channel(&sums,a,uVar3);
              pvVar21 = sums.data;
              Mat::~Mat(&sums);
              pvVar4 = b->data;
              for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)pvVar4 + uVar6 * 4) =
                     ABS(*(float *)((long)pvVar21 + uVar6 * 4)) +
                     *(float *)((long)pvVar4 + uVar6 * 4);
              }
              uVar6 = (ulong)(uVar3 + 1);
            }
          }
          goto LAB_001e4ea2;
        }
        Mat::create(b,uVar3,1,1,sVar1,*(Allocator **)(lVar5 + 8));
        pMVar14 = (Mat *)(ulong)uVar3;
        Mat::Mat(&sums,uVar3,1,uVar20,sVar1,*(Allocator **)(lVar5 + 0x10));
        local_d8 = -100;
        iVar11 = -100;
        if ((sums.data != (void *)0x0) && (iVar11 = local_d8, (long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar17 = 0;
          uVar18 = 0;
          if (0 < (int)uVar3) {
            uVar18 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
            Mat::channel(&local_78,a,uVar17);
            pvVar4 = local_78.data;
            Mat::~Mat(&local_78);
            pMVar14 = &sums;
            Mat::channel(&local_78,pMVar14,uVar17);
            pvVar21 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)pvVar21 + uVar6 * 4) =
                     ABS(*(float *)((long)pvVar4 + uVar6 * 4)) +
                     *(float *)((long)pvVar21 + uVar6 * 4);
              }
              pvVar4 = (void *)((long)pvVar4 + lVar19 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_d8 = 0;
          for (uVar3 = 0; iVar11 = local_d8, uVar3 != uVar20; uVar3 = uVar3 + 1) {
            pMVar14 = &sums;
            Mat::channel(&local_78,&sums,uVar3);
            pvVar21 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar4 = b->data;
            for (uVar6 = 0; uVar18 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar4 + uVar6 * 4) =
                   *(float *)((long)pvVar21 + uVar6 * 4) + *(float *)((long)pvVar4 + uVar6 * 4);
            }
          }
        }
      }
    }
  }
  else {
    if (iVar11 != 2) {
      if (iVar11 != 1) goto LAB_001e4ea2;
      uVar3 = a->w;
      pMVar14 = (Mat *)0x1;
      Mat::create(b,1,sVar1,*(Allocator **)(lVar5 + 8));
      uVar6 = 0;
      uVar18 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar18 = uVar6;
      }
      fVar24 = 0.0;
      for (; uVar18 != uVar6; uVar6 = uVar6 + 1) {
        fVar24 = fVar24 + ABS(*(float *)((long)a->data + uVar6 * 4));
      }
LAB_001e3cf3:
      *(float *)b->data = fVar24;
      goto LAB_001e4ea2;
    }
    uVar3 = a->w;
    uVar22 = a->h;
    uVar18 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
    bVar12 = (byte)uVar18 ^ 1;
    if (bVar12 != 0 || !reduce_h) {
      bVar12 = bVar12 | reduce_h;
      if (bVar12 == 0) {
        Mat::create(b,1,uVar22,sVar1,*(Allocator **)(lVar5 + 8));
        pvVar4 = a->data;
        iVar11 = a->w;
        sVar1 = a->elemsize;
        pvVar21 = b->data;
        pMVar14 = (Mat *)0x0;
        pMVar7 = (Mat *)(ulong)uVar3;
        if ((int)uVar3 < 1) {
          pMVar7 = pMVar14;
        }
        pMVar23 = (Mat *)(ulong)uVar22;
        if ((int)uVar22 < 1) {
          pMVar23 = pMVar14;
        }
        for (; pMVar14 != pMVar23; pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
          fVar24 = 0.0;
          for (pMVar16 = (Mat *)0x0; pMVar7 != pMVar16; pMVar16 = (Mat *)((long)&pMVar16->data + 1))
          {
            fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + (long)pMVar16 * 4));
          }
          *(float *)((long)pvVar21 + (long)pMVar14 * 4) = fVar24;
          pvVar4 = (void *)((long)pvVar4 + (long)iVar11 * sVar1);
        }
      }
      else {
        pMVar14 = (Mat *)CONCAT71((int7)(uVar18 >> 8),bVar12);
        if (reduce_h && !reduce_w) {
          pMVar14 = (Mat *)(ulong)uVar3;
          Mat::create(b,uVar3,1,sVar1,*(Allocator **)(lVar5 + 8));
          Mat::fill(b,0.0);
          pvVar4 = a->data;
          iVar11 = a->w;
          sVar1 = a->elemsize;
          uVar6 = 0;
          uVar18 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar18 = uVar6;
          }
          uVar9 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar9 = uVar6;
          }
          for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
            pMVar14 = (Mat *)b->data;
            for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
              *(float *)((long)&pMVar14->data + uVar15 * 4) =
                   ABS(*(float *)((long)pvVar4 + uVar15 * 4)) +
                   *(float *)((long)&pMVar14->data + uVar15 * 4);
            }
            pvVar4 = (void *)((long)pvVar4 + (long)iVar11 * sVar1);
          }
        }
      }
      goto LAB_001e4ea2;
    }
    local_d8 = -100;
    Mat::create(b,1,1,sVar1,*(Allocator **)(lVar5 + 8));
    pMVar14 = (Mat *)(ulong)uVar22;
    Mat::Mat(&sums,uVar22,sVar1,*(Allocator **)(lVar5 + 0x10));
    iVar11 = local_d8;
    if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
      pvVar4 = a->data;
      iVar11 = a->w;
      sVar1 = a->elemsize;
      pMVar14 = (Mat *)0x0;
      pMVar7 = (Mat *)(ulong)uVar3;
      if ((int)uVar3 < 1) {
        pMVar7 = pMVar14;
      }
      pMVar23 = (Mat *)(ulong)uVar22;
      if ((int)uVar22 < 1) {
        pMVar23 = pMVar14;
      }
      for (; pMVar14 != pMVar23; pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
        fVar24 = 0.0;
        for (pMVar16 = (Mat *)0x0; pMVar7 != pMVar16; pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
          fVar24 = fVar24 + ABS(*(float *)((long)pvVar4 + (long)pMVar16 * 4));
        }
        *(float *)((long)sums.data + (long)pMVar14 * 4) = fVar24;
        pvVar4 = (void *)((long)pvVar4 + (long)iVar11 * sVar1);
      }
      fVar24 = 0.0;
      for (pMVar7 = (Mat *)0x0; pMVar23 != pMVar7; pMVar7 = (Mat *)((long)&pMVar7->data + 1)) {
        fVar24 = fVar24 + *(float *)((long)sums.data + (long)pMVar7 * 4);
      }
      goto LAB_001e4710;
    }
  }
  local_d8 = iVar11;
  Mat::~Mat(&sums);
  if (local_d8 != 0) {
    return -100;
  }
LAB_001e4ea2:
  if (1.1920929e-07 < ABS(v0 + -1.0)) {
    reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)pMVar14);
  }
  return 0;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret;
    if (keepdims)
        ret = reduction_op_keepdims<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    else
        ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }
    return ret;
}